

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_rp_pack_rects(nk_rp_context *context,nk_rp_rect *rects,int num_rects)

{
  nk_rp__findresult nVar1;
  bool local_31;
  nk_rp__findresult fr;
  int i;
  int num_rects_local;
  nk_rp_rect *rects_local;
  nk_rp_context *context_local;
  
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    rects[(int)fr.prev_link].was_packed = (int)fr.prev_link;
  }
  nk_rp_qsort(rects,num_rects,nk_rect_height_compare);
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    nVar1 = nk_rp__skyline_pack_rectangle
                      (context,(uint)rects[(int)fr.prev_link].w,(uint)rects[(int)fr.prev_link].h);
    fr._0_8_ = nVar1.prev_link;
    if (fr._0_8_ == 0) {
      rects[(int)fr.prev_link].y = 0xffff;
      rects[(int)fr.prev_link].x = 0xffff;
    }
    else {
      rects[(int)fr.prev_link].x = (nk_rp_coord)nVar1.x;
      rects[(int)fr.prev_link].y = (nk_rp_coord)nVar1.y;
    }
  }
  nk_rp_qsort(rects,num_rects,nk_rect_original_order);
  for (fr.prev_link._0_4_ = 0; (int)fr.prev_link < num_rects;
      fr.prev_link._0_4_ = (int)fr.prev_link + 1) {
    local_31 = false;
    if (rects[(int)fr.prev_link].x == 0xffff) {
      local_31 = rects[(int)fr.prev_link].y == 0xffff;
    }
    rects[(int)fr.prev_link].was_packed = (uint)((local_31 ^ 0xffU) & 1);
  }
  return;
}

Assistant:

NK_INTERN void
nk_rp_pack_rects(struct nk_rp_context *context, struct nk_rp_rect *rects, int num_rects)
{
    int i;
    /* we use the 'was_packed' field internally to allow sorting/unsorting */
    for (i=0; i < num_rects; ++i) {
        rects[i].was_packed = i;
    }

    /* sort according to heuristic */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_height_compare);

    for (i=0; i < num_rects; ++i) {
        struct nk_rp__findresult fr = nk_rp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
        if (fr.prev_link) {
            rects[i].x = (nk_rp_coord) fr.x;
            rects[i].y = (nk_rp_coord) fr.y;
        } else {
            rects[i].x = rects[i].y = NK_RP__MAXVAL;
        }
    }

    /* unsort */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_original_order);

    /* set was_packed flags */
    for (i=0; i < num_rects; ++i)
        rects[i].was_packed = !(rects[i].x == NK_RP__MAXVAL && rects[i].y == NK_RP__MAXVAL);
}